

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transfer_Control_Request_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Transfer_Control_Request_PDU::~Transfer_Control_Request_PDU
          (Transfer_Control_Request_PDU *this)

{
  pointer pRVar1;
  pointer pRVar2;
  pointer pRVar3;
  
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Transfer_Control_Request_PDU_002219d0;
  pRVar1 = (this->m_vRecs).
           super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (this->m_vRecs).
           super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pRVar3 = pRVar1;
  if (pRVar2 != pRVar1) {
    do {
      (**(pRVar3->super_DataTypeBase)._vptr_DataTypeBase)(pRVar3);
      pRVar3 = pRVar3 + 1;
    } while (pRVar3 != pRVar2);
    (this->m_vRecs).
    super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>.
    _M_impl.super__Vector_impl_data._M_finish = pRVar1;
  }
  std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::~vector
            (&this->m_vRecs);
  DATA_TYPE::EntityIdentifier::~EntityIdentifier(&this->m_TrnsEntID);
  Simulation_Management_Header::~Simulation_Management_Header
            (&this->super_Simulation_Management_Header);
  return;
}

Assistant:

Transfer_Control_Request_PDU::~Transfer_Control_Request_PDU()
{
    m_vRecs.clear();
}